

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  int number;
  uint32_t uVar1;
  int local_34;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  local_34 = value;
  if (((byte)field[1] & 8) == 0) {
    SetField<int>(this,message,field,&local_34);
  }
  else {
    uVar1 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 4);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),&local_28,&local_30);
    }
    internal::ExtensionSet::SetEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),number,
               (FieldType)field[2],value,field);
  }
  return;
}

Assistant:

void Reflection::SetEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetEnum(field->number(), field->type(), value,
                                          field);
  } else {
    SetField<int>(message, field, value);
  }
}